

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolCopyStringN(STRING_POOL *pool,XML_Char *s,int n)

{
  XML_Char XVar1;
  XML_Char *pXVar2;
  XML_Bool XVar3;
  int local_24;
  XML_Char *pXStack_20;
  int n_local;
  XML_Char *s_local;
  STRING_POOL *pool_local;
  
  local_24 = n;
  pXStack_20 = s;
  if ((pool->ptr == (XML_Char *)0x0) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
    pool_local = (STRING_POOL *)0x0;
  }
  else {
    for (; 0 < local_24; local_24 = local_24 + -1) {
      if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
        return (XML_Char *)0x0;
      }
      XVar1 = *pXStack_20;
      pXVar2 = pool->ptr;
      pool->ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
      pXStack_20 = pXStack_20 + 1;
    }
    pool_local = (STRING_POOL *)pool->start;
    pool->start = pool->ptr;
  }
  return (XML_Char *)pool_local;
}

Assistant:

static const XML_Char *
poolCopyStringN(STRING_POOL *pool, const XML_Char *s, int n) {
  if (! pool->ptr && ! poolGrow(pool)) {
    /* The following line is unreachable given the current usage of
     * poolCopyStringN().  Currently it is called from exactly one
     * place to copy the text of a simple general entity.  By that
     * point, the name of the entity is already stored in the pool, so
     * pool->ptr cannot be NULL.
     *
     * If poolCopyStringN() is used elsewhere as it well might be,
     * this line may well become executable again.  Regardless, this
     * sort of check shouldn't be removed lightly, so we just exclude
     * it from the coverage statistics.
     */
    return NULL; /* LCOV_EXCL_LINE */
  }
  for (; n > 0; --n, s++) {
    if (! poolAppendChar(pool, *s))
      return NULL;
  }
  s = pool->start;
  poolFinish(pool);
  return s;
}